

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

BOOL __thiscall Js::TypedArrayBase::IsConfigurable(TypedArrayBase *this,PropertyId propertyId)

{
  BOOL BVar1;
  BOOL BVar2;
  uint32 local_1c [2];
  uint32 index;
  
  local_1c[0] = 0;
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                         super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_1c);
  BVar2 = 0;
  if (BVar1 == 0) {
    BVar2 = DynamicObject::IsConfigurable((DynamicObject *)this,propertyId);
  }
  return BVar2;
}

Assistant:

BOOL TypedArrayBase::IsConfigurable(PropertyId propertyId)
    {
        uint32 index = 0;
        if (GetScriptContext()->IsNumericPropertyId(propertyId, &index))
        {
            return false;
        }
        return DynamicObject::IsConfigurable(propertyId);
    }